

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  EditType EVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pdVar7;
  double dVar8;
  unsigned_long uVar9;
  pointer pdVar10;
  iterator __position;
  pointer pEVar11;
  pointer pEVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  EditType *pEVar21;
  undefined4 uVar22;
  pointer pEVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  EditType move;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  allocator_type local_8a;
  allocator_type local_89;
  vector<double,_std::allocator<double>_> local_88;
  pointer local_70;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_68;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  undefined1 auVar36 [64];
  
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_88,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_68);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,((long)puVar6 - (long)puVar5 >> 3) + 1,&local_88,&local_8a);
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector(&local_68,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_8a);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)&local_88,((long)puVar6 - (long)puVar5 >> 3) + 1,&local_68,&local_89);
  if ((void *)CONCAT44(local_68.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (EditType)
                       local_68.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_68.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (EditType)
                                     local_68.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
  }
  if ((long)local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar38._8_4_ = 2;
    auVar38._0_8_ = 0x200000002;
    auVar38._12_4_ = 2;
    auVar38._16_4_ = 2;
    auVar38._20_4_ = 2;
    auVar38._24_4_ = 2;
    auVar38._28_4_ = 2;
    auVar33 = vpbroadcastq_avx512f(ZEXT816(8));
    lVar26 = ((long)local_48.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar26 = lVar26 + (ulong)(lVar26 == 0);
    lVar27 = lVar26 + -1;
    uVar24 = lVar26 + 7U & 0xfffffffffffffff8;
    auVar34 = vpbroadcastq_avx512f();
    do {
      vpmullq_avx512dq(auVar31,auVar32);
      uVar28 = vpcmpuq_avx512f(auVar31,auVar34,2);
      auVar35 = vcvtuqq2pd_avx512dq(auVar31);
      auVar31 = vpaddq_avx512f(auVar31,auVar33);
      uVar24 = uVar24 - 8;
      auVar36 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)local_48.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar27));
      auVar37._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * auVar36._8_8_;
      auVar37._0_8_ = (ulong)((byte)uVar28 & 1) * auVar36._0_8_;
      auVar37._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * auVar36._16_8_;
      auVar37._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * auVar36._24_8_;
      auVar37._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * auVar36._32_8_;
      auVar37._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * auVar36._40_8_;
      auVar37._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * auVar36._48_8_;
      auVar37._56_8_ = (uVar28 >> 7) * auVar36._56_8_;
      vscatterqpd_avx512f(ZEXT864(0) + auVar37,uVar28,auVar35);
      auVar35 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)local_88.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar27));
      auVar30._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * auVar35._8_8_;
      auVar30._0_8_ = (ulong)((byte)uVar28 & 1) * auVar35._0_8_;
      auVar30._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * auVar35._16_8_;
      auVar30._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * auVar35._24_8_;
      vpscatterqd_avx512f(ZEXT832(0) + auVar30,uVar28,auVar38);
    } while (uVar24 != 0);
  }
  pdVar7 = ((local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar24 = (long)((local_48.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
  if (1 < uVar24) {
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar39._8_4_ = 1;
    auVar39._0_8_ = 0x100000001;
    auVar39._12_4_ = 1;
    auVar39._16_4_ = 1;
    auVar39._20_4_ = 1;
    auVar39._24_4_ = 1;
    auVar39._28_4_ = 1;
    auVar33 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar34 = vpbroadcastq_avx512f();
    uVar28 = 0;
    dVar8 = *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      auVar35 = vcvtuqq2pd_avx512dq(auVar31);
      auVar36 = vpbroadcastq_avx512f();
      auVar31 = vpaddq_avx512f(auVar31,auVar33);
      auVar36 = vporq_avx512f(auVar36,auVar32);
      uVar20 = vpcmpuq_avx512f(auVar36,auVar34,2);
      pdVar10 = pdVar7 + uVar28 + 1;
      bVar13 = (bool)((byte)uVar20 & 1);
      bVar14 = (bool)((byte)(uVar20 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar20 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar20 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar20 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar20 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar20 >> 6) & 1);
      *pdVar10 = (double)((ulong)bVar13 * auVar35._0_8_ | (ulong)!bVar13 * (long)*pdVar10);
      pdVar10[1] = (double)((ulong)bVar14 * auVar35._8_8_ | (ulong)!bVar14 * (long)pdVar10[1]);
      pdVar10[2] = (double)((ulong)bVar15 * auVar35._16_8_ | (ulong)!bVar15 * (long)pdVar10[2]);
      pdVar10[3] = (double)((ulong)bVar16 * auVar35._24_8_ | (ulong)!bVar16 * (long)pdVar10[3]);
      pdVar10[4] = (double)((ulong)bVar17 * auVar35._32_8_ | (ulong)!bVar17 * (long)pdVar10[4]);
      pdVar10[5] = (double)((ulong)bVar18 * auVar35._40_8_ | (ulong)!bVar18 * (long)pdVar10[5]);
      pdVar10[6] = (double)((ulong)bVar19 * auVar35._48_8_ | (ulong)!bVar19 * (long)pdVar10[6]);
      pdVar10[7] = (double)((uVar20 >> 7) * auVar35._56_8_ |
                           (ulong)!SUB81(uVar20 >> 7,0) * (long)pdVar10[7]);
      auVar38 = vmovdqu32_avx512vl(auVar39);
      *(undefined1 (*) [32])((long)dVar8 + 4 + uVar28 * 4) = auVar38;
      uVar28 = uVar28 + 8;
    } while ((uVar24 + 6 & 0xfffffffffffffff8) != uVar28);
  }
  local_70 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar26 = (long)local_50 - (long)local_70 >> 3;
  if (local_50 != local_70) {
    lVar27 = (long)puVar6 - (long)puVar5 >> 3;
    lVar29 = 0;
    do {
      if (puVar6 != puVar5) {
        lVar25 = 0;
        uVar9 = local_70[lVar29];
        dVar8 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(lVar29 + 1) * 3];
        do {
          if (uVar9 == puVar5[lVar25]) {
            local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar29 + 1].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar25 + 1] =
                 local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar29].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar25];
            uVar22 = 0;
          }
          else {
            pdVar7 = local_48.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar29].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar10 = local_48.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar29 + 1].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar1 = pdVar10[lVar25];
            dVar2 = pdVar7[lVar25 + 1];
            dVar3 = pdVar7[lVar25];
            if ((dVar2 <= dVar1) || (dVar3 <= dVar1)) {
              if ((dVar1 <= dVar2) || (dVar3 <= dVar2)) {
                pdVar10[lVar25 + 1] = dVar3 + 1.00001;
                uVar22 = 3;
              }
              else {
                pdVar10[lVar25 + 1] = dVar2 + 1.0;
                uVar22 = 2;
              }
            }
            else {
              pdVar10[lVar25 + 1] = dVar1 + 1.0;
              uVar22 = 1;
            }
          }
          *(undefined4 *)((long)dVar8 + 4 + lVar25 * 4) = uVar22;
          lVar25 = lVar25 + 1;
        } while (lVar27 + (ulong)(lVar27 == 0) != lVar25);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 != lVar26 + (ulong)(lVar26 == 0));
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (puVar6 != puVar5 || local_50 != local_70) {
    lVar27 = (long)puVar6 - (long)puVar5 >> 3;
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(EditType *)
            ((long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar26 * 3] + lVar27 * 4);
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  ((vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
                    *)__return_storage_ptr__,__position,(EditType *)&local_68);
      }
      else {
        *__position._M_current =
             (EditType)
             local_68.
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar26 = lVar26 - (ulong)((EditType)
                                local_68.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kAdd);
      lVar27 = lVar27 - (ulong)((EditType)
                                local_68.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kRemove);
    } while (lVar26 != 0 || lVar27 != 0);
    pEVar11 = (__return_storage_ptr__->
              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pEVar12 = (__return_storage_ptr__->
              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pEVar23 = pEVar12 + -1;
    if (pEVar11 < pEVar23 && pEVar11 != pEVar12) {
      do {
        pEVar21 = pEVar11 + 1;
        EVar4 = *pEVar11;
        *pEVar11 = *pEVar23;
        *pEVar23 = EVar4;
        pEVar23 = pEVar23 + -1;
        pEVar11 = pEVar21;
      } while (pEVar21 < pEVar23);
    }
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)&local_88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}